

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O3

void __thiscall ThreadContext::ClearInlineCaches(ThreadContext *this)

{
  bool bVar1;
  size_t sVar2;
  ScriptContext *pSVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,InlineCachePhase);
  if (bVar1) {
    pSVar3 = this->scriptContextList;
    if (pSVar3 == (ScriptContext *)0x0) {
      uVar4 = 0;
      uVar5 = 0;
      uVar7 = 0;
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      uVar7 = 0;
      uVar5 = 0;
      uVar4 = 0;
      do {
        uVar6 = uVar6 + 1;
        sVar2 = Memory::ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>::
                AllocatedSize(&(pSVar3->inlineCacheAllocator).
                               super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                             );
        uVar4 = uVar4 + sVar2;
        uVar5 = uVar5 + (pSVar3->inlineCacheAllocator).
                        super_ArenaAllocatorBase<Memory::InlineCacheFreeListPolicy,_5UL,_true,_1024UL>
                        .freeListSize;
        uVar7 = uVar7 + (pSVar3->inlineCacheAllocator).polyCacheAllocSize;
        pSVar3 = pSVar3->next;
      } while (pSVar3 != (ScriptContext *)0x0);
      uVar4 = uVar4 >> 10;
      uVar5 = uVar5 >> 10;
      uVar7 = uVar7 >> 10;
    }
    Output::Print(L"Inline cache arena: total = %5I64u KB, free list = %5I64u KB, poly caches = %5I64u KB, script contexts = %u\n"
                  ,uVar4,uVar5,uVar7,(ulong)uVar6);
  }
  for (pSVar3 = this->scriptContextList; pSVar3 != (ScriptContext *)0x0; pSVar3 = pSVar3->next) {
    Js::ScriptContext::ClearInlineCaches(pSVar3);
  }
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Reset
            (&(this->inlineCacheThreadInfoAllocator).
              super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>);
  (this->protoInlineCacheByPropId).size = 0;
  (this->protoInlineCacheByPropId).bucketCount = 0;
  (this->protoInlineCacheByPropId).count = 0;
  (this->protoInlineCacheByPropId).freeCount = 0;
  (this->protoInlineCacheByPropId).modFunctionIndex = 0x4b;
  (this->protoInlineCacheByPropId).buckets = (Type)0x0;
  (this->protoInlineCacheByPropId).entries = (Type)0x0;
  (this->storeFieldInlineCacheByPropId).size = 0;
  (this->storeFieldInlineCacheByPropId).bucketCount = 0;
  (this->storeFieldInlineCacheByPropId).count = 0;
  (this->storeFieldInlineCacheByPropId).freeCount = 0;
  (this->storeFieldInlineCacheByPropId).modFunctionIndex = 0x4b;
  (this->storeFieldInlineCacheByPropId).buckets = (Type)0x0;
  (this->storeFieldInlineCacheByPropId).entries = (Type)0x0;
  this->registeredInlineCacheCount = 0;
  this->unregisteredInlineCacheCount = 0;
  return;
}

Assistant:

void
ThreadContext::ClearInlineCaches()
{
    if (PHASE_TRACE1(Js::InlineCachePhase))
    {
        size_t size = 0;
        size_t freeListSize = 0;
        size_t polyInlineCacheSize = 0;
        uint scriptContextCount = 0;
        for (Js::ScriptContext *scriptContext = scriptContextList;
            scriptContext;
            scriptContext = scriptContext->next)
        {
            scriptContextCount++;
            size += scriptContext->GetInlineCacheAllocator()->AllocatedSize();
            freeListSize += scriptContext->GetInlineCacheAllocator()->FreeListSize();
#ifdef POLY_INLINE_CACHE_SIZE_STATS
            polyInlineCacheSize += scriptContext->GetInlineCacheAllocator()->GetPolyInlineCacheSize();
#endif
        };
        Output::Print(_u("Inline cache arena: total = %5I64u KB, free list = %5I64u KB, poly caches = %5I64u KB, script contexts = %u\n"),
            static_cast<uint64>(size / 1024), static_cast<uint64>(freeListSize / 1024), static_cast<uint64>(polyInlineCacheSize / 1024), scriptContextCount);
    }

    Js::ScriptContext *scriptContext = this->scriptContextList;
    while (scriptContext != nullptr)
    {
        scriptContext->ClearInlineCaches();
        scriptContext = scriptContext->next;
    }

    inlineCacheThreadInfoAllocator.Reset();
    protoInlineCacheByPropId.ResetNoDelete();
    storeFieldInlineCacheByPropId.ResetNoDelete();

    registeredInlineCacheCount = 0;
    unregisteredInlineCacheCount = 0;
}